

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall adios2sys::CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  undefined8 *in_RDI;
  CommandLineArgumentsInternal *this_00;
  
  this_00 = (CommandLineArgumentsInternal *)*in_RDI;
  if (this_00 != (CommandLineArgumentsInternal *)0x0) {
    CommandLineArgumentsInternal::~CommandLineArgumentsInternal(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

CommandLineArguments::~CommandLineArguments()
{
  delete this->Internals;
}